

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_bool32 ma_context_is_device_id_equal__alsa
                    (ma_context *pContext,ma_device_id *pID0,ma_device_id *pID1)

{
  uint uVar1;
  ma_uint8 mVar2;
  ma_uint8 *pmVar3;
  
  if (pContext == (ma_context *)0x0) {
    __assert_fail("pContext != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x413e,
                  "ma_bool32 ma_context_is_device_id_equal__alsa(ma_context *, const ma_device_id *, const ma_device_id *)"
                 );
  }
  if (pID0 == (ma_device_id *)0x0) {
    __assert_fail("pID0 != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x413f,
                  "ma_bool32 ma_context_is_device_id_equal__alsa(ma_context *, const ma_device_id *, const ma_device_id *)"
                 );
  }
  if (pID1 == (ma_device_id *)0x0) {
    __assert_fail("pID1 != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x4140,
                  "ma_bool32 ma_context_is_device_id_equal__alsa(ma_context *, const ma_device_id *, const ma_device_id *)"
                 );
  }
  if (pID0 == pID1) {
    uVar1 = 1;
  }
  else {
    mVar2 = pID0->dsound[0];
    if (mVar2 != '\0') {
      pmVar3 = pID0->dsound + 1;
      do {
        if (mVar2 != pID1->dsound[0]) break;
        pID1 = (ma_device_id *)(pID1->dsound + 1);
        mVar2 = *pmVar3;
        pmVar3 = pmVar3 + 1;
      } while (mVar2 != '\0');
    }
    uVar1 = (uint)(mVar2 == pID1->dsound[0]);
  }
  return uVar1;
}

Assistant:

static ma_bool32 ma_context_is_device_id_equal__alsa(ma_context* pContext, const ma_device_id* pID0, const ma_device_id* pID1)
{
    MA_ASSERT(pContext != NULL);
    MA_ASSERT(pID0 != NULL);
    MA_ASSERT(pID1 != NULL);
    (void)pContext;

    return ma_strcmp(pID0->alsa, pID1->alsa) == 0;
}